

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-udp-try-send.c
# Opt level: O2

void sv_recv_cb(uv_udp_t *handle,ssize_t nread,uv_buf_t *rcvbuf,sockaddr *addr,uint flags)

{
  int iVar1;
  char *__format;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  undefined8 uStackY_50;
  char *pcVar5;
  int64_t eval_b;
  int64_t eval_a;
  
  eval_b = 0;
  if (nread < 1) {
    pcVar3 = ">";
    pcVar4 = "0";
    pcVar2 = "nread";
    uStackY_50 = 0x3f;
    eval_a = nread;
  }
  else {
    if (nread == 0) {
      if (addr == (sockaddr *)0x0) {
        return;
      }
      pcVar3 = "==";
      pcVar5 = "==";
      uStackY_50 = 0x42;
LAB_001acadb:
      eval_b = 0;
      pcVar4 = "NULL";
      pcVar2 = "addr";
      __format = "Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n";
      eval_a = (int64_t)addr;
      goto LAB_001acade;
    }
    eval_a = 4;
    if (nread == 4) {
      if (addr == (sockaddr *)0x0) {
        pcVar3 = "!=";
        pcVar5 = "!=";
        addr = (sockaddr *)0x0;
        uStackY_50 = 0x47;
        goto LAB_001acadb;
      }
      iVar1 = memcmp("EXIT",rcvbuf->base,4);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        uv_close((uv_handle_t *)handle,close_cb);
        uv_close((uv_handle_t *)&client,close_cb);
        sv_recv_cb_called = sv_recv_cb_called + 1;
        return;
      }
      pcVar3 = "==";
      pcVar4 = "0";
      pcVar2 = "memcmp(\"EXIT\", rcvbuf->base, nread)";
      uStackY_50 = 0x49;
    }
    else {
      pcVar3 = "==";
      pcVar4 = "nread";
      pcVar2 = "4";
      uStackY_50 = 0x46;
      eval_b = nread;
    }
  }
  __format = "Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n";
  pcVar5 = pcVar3;
LAB_001acade:
  fprintf(_stderr,__format,
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-udp-try-send.c"
          ,uStackY_50,pcVar2,pcVar3,pcVar4,eval_a,pcVar5,eval_b);
  abort();
}

Assistant:

static void sv_recv_cb(uv_udp_t* handle,
                       ssize_t nread,
                       const uv_buf_t* rcvbuf,
                       const struct sockaddr* addr,
                       unsigned flags) {
  ASSERT_GT(nread, 0);

  if (nread == 0) {
    ASSERT_NULL(addr);
    return;
  }

  ASSERT_EQ(4, nread);
  ASSERT_NOT_NULL(addr);

  ASSERT_OK(memcmp("EXIT", rcvbuf->base, nread));
  uv_close((uv_handle_t*) handle, close_cb);
  uv_close((uv_handle_t*) &client, close_cb);

  sv_recv_cb_called++;
}